

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_getAtts(ENCODING *enc,char *ptr,int attsMax,ATTRIBUTE *atts)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  int iVar6;
  char cVar7;
  byte *pbVar8;
  
  iVar3 = 0;
  cVar7 = '\0';
  iVar4 = 1;
switchD_00335493_caseD_4:
  while( true ) {
    iVar6 = iVar4;
    pbVar8 = (byte *)ptr;
    pbVar1 = pbVar8 + 2;
    bVar2 = pbVar8[3];
    ptr = (char *)pbVar1;
    iVar4 = iVar6;
    if (bVar2 == 0) break;
    if (bVar2 - 0xd8 < 4) {
switchD_00335493_caseD_7:
      if ((iVar6 == 0) && (iVar6 = 1, iVar3 < attsMax)) {
        atts[iVar3].name = (char *)pbVar1;
        atts[iVar3].normalized = '\x01';
        iVar6 = 1;
      }
      ptr = (char *)(pbVar8 + 4);
      iVar4 = iVar6;
    }
    else if (3 < bVar2 - 0xdc) {
      if (bVar2 != 0xff) goto switchD_00335493_caseD_5;
      if (*pbVar1 < 0xfe && iVar6 == 0) {
LAB_003354a5:
        iVar4 = 1;
        if (iVar3 < attsMax) {
          atts[iVar3].name = (char *)pbVar1;
          atts[iVar3].normalized = '\x01';
          iVar4 = 1;
        }
      }
    }
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar1)) {
  case 3:
    if (iVar3 < attsMax) {
      atts[iVar3].normalized = '\0';
    }
  default:
    goto switchD_00335493_caseD_4;
  case 5:
  case 0x16:
  case 0x18:
  case 0x1d:
switchD_00335493_caseD_5:
    if (iVar6 == 0) goto LAB_003354a5;
    goto switchD_00335493_caseD_4;
  case 6:
    ptr = (char *)(pbVar8 + 3);
    if ((iVar6 == 0) && (iVar4 = 1, iVar3 < attsMax)) {
      atts[iVar3].name = (char *)pbVar1;
      atts[iVar3].normalized = '\x01';
      iVar4 = 1;
    }
    goto switchD_00335493_caseD_4;
  case 7:
    goto switchD_00335493_caseD_7;
  case 9:
  case 10:
    iVar4 = 0;
    if (((iVar6 != 1) && (iVar4 = iVar6, iVar6 == 2)) && (iVar4 = 2, iVar3 < attsMax)) {
      atts[iVar3].normalized = '\0';
    }
    goto switchD_00335493_caseD_4;
  case 0xb:
  case 0x11:
    goto switchD_00335493_caseD_b;
  case 0xc:
    if (iVar6 == 2) {
      iVar4 = 2;
      if (cVar7 == '\f') {
        if (iVar3 < attsMax) {
          atts[iVar3].valueEnd = (char *)pbVar1;
        }
        iVar3 = iVar3 + 1;
        cVar7 = '\f';
        iVar4 = 0;
      }
      goto switchD_00335493_caseD_4;
    }
    cVar7 = '\f';
    break;
  case 0xd:
    if (iVar6 == 2) {
      iVar4 = 2;
      if (cVar7 == '\r') {
        if (iVar3 < attsMax) {
          atts[iVar3].valueEnd = (char *)pbVar1;
        }
        iVar3 = iVar3 + 1;
        cVar7 = '\r';
        iVar4 = 0;
      }
      goto switchD_00335493_caseD_4;
    }
    cVar7 = '\r';
    break;
  case 0x15:
    iVar4 = 0;
    if ((((iVar6 != 1) && (iVar4 = iVar6, iVar6 == 2)) && (iVar4 = 2, iVar3 < attsMax)) &&
       (atts[iVar3].normalized != '\0')) {
      if ((pbVar1 != (byte *)atts[iVar3].valuePtr) && (*pbVar1 == 0x20)) {
        bVar2 = pbVar8[5];
        cVar5 = '\a';
        if (3 < bVar2 - 0xd8) {
          if (bVar2 - 0xdc < 4) {
            cVar5 = '\b';
          }
          else if (bVar2 == 0xff) {
            cVar5 = '\0';
            if (pbVar8[4] < 0xfe) goto LAB_00335707;
          }
          else if (bVar2 == 0) {
            if ((ulong)pbVar8[4] == 0x20) goto LAB_00335719;
            cVar5 = *(char *)((long)enc[1].scanners + (ulong)pbVar8[4]);
          }
          else {
LAB_00335707:
            cVar5 = '\x1d';
          }
        }
        if (cVar5 != cVar7) goto switchD_00335493_caseD_4;
      }
LAB_00335719:
      atts[iVar3].normalized = '\0';
    }
    goto switchD_00335493_caseD_4;
  }
  iVar4 = 2;
  if (iVar3 < attsMax) {
    atts[iVar3].valuePtr = (char *)(pbVar8 + 4);
  }
  goto switchD_00335493_caseD_4;
switchD_00335493_caseD_b:
  iVar4 = 2;
  if (iVar6 != 2) {
    return iVar3;
  }
  goto switchD_00335493_caseD_4;
}

Assistant:

static int PTRCALL
PREFIX(getAtts)(const ENCODING *enc, const char *ptr,
                int attsMax, ATTRIBUTE *atts)
{
  enum { other, inName, inValue } state = inName;
  int nAtts = 0;
  int open = 0; /* defined when state == inValue;
                   initialization just to shut up compilers */

  for (ptr += MINBPC(enc);; ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define START_NAME \
      if (state == other) { \
        if (nAtts < attsMax) { \
          atts[nAtts].name = ptr; \
          atts[nAtts].normalized = 1; \
        } \
        state = inName; \
      }
#define LEAD_CASE(n) \
    case BT_LEAD ## n: START_NAME ptr += (n - MINBPC(enc)); break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_NONASCII:
    case BT_NMSTRT:
    case BT_HEX:
      START_NAME
      break;
#undef START_NAME
    case BT_QUOT:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_QUOT;
      }
      else if (open == BT_QUOT) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_APOS:
      if (state != inValue) {
        if (nAtts < attsMax)
          atts[nAtts].valuePtr = ptr + MINBPC(enc);
        state = inValue;
        open = BT_APOS;
      }
      else if (open == BT_APOS) {
        state = other;
        if (nAtts < attsMax)
          atts[nAtts].valueEnd = ptr;
        nAtts++;
      }
      break;
    case BT_AMP:
      if (nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_S:
      if (state == inName)
        state = other;
      else if (state == inValue
               && nAtts < attsMax
               && atts[nAtts].normalized
               && (ptr == atts[nAtts].valuePtr
                   || BYTE_TO_ASCII(enc, ptr) != ASCII_SPACE
                   || BYTE_TO_ASCII(enc, ptr + MINBPC(enc)) == ASCII_SPACE
                   || BYTE_TYPE(enc, ptr + MINBPC(enc)) == open))
        atts[nAtts].normalized = 0;
      break;
    case BT_CR: case BT_LF:
      /* This case ensures that the first attribute name is counted
         Apart from that we could just change state on the quote. */
      if (state == inName)
        state = other;
      else if (state == inValue && nAtts < attsMax)
        atts[nAtts].normalized = 0;
      break;
    case BT_GT:
    case BT_SOL:
      if (state != inValue)
        return nAtts;
      break;
    default:
      break;
    }
  }
  /* not reached */
}